

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_two(jpeg_encoder *this,int component_num)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint len;
  long lVar6;
  bool bVar7;
  
  bVar7 = component_num != 0;
  uVar1 = (ulong)bVar7;
  uVar3 = (int)this->m_coefficient_array[0] - this->m_last_dc_val[component_num];
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  this->m_last_dc_val[component_num] = (int)this->m_coefficient_array[0];
  lVar6 = 0;
  for (; uVar2 != 0; uVar2 = uVar2 >> 1) {
    lVar6 = lVar6 + 1;
  }
  put_bits(this,this->m_huff_codes[bVar7][lVar6],
           (uint)this->m_comp_h_samp[lVar6 + (uVar1 * 0x100 | 0x144c) + -0x15]);
  if ((uint)lVar6 != 0) {
    put_bits(this,~(-1 << ((byte)lVar6 & 0x1f)) & ((int)uVar3 >> 0x1f) + uVar3,(uint)lVar6);
  }
  iVar5 = 0;
  for (lVar6 = 1; lVar6 != 0x40; lVar6 = lVar6 + 1) {
    uVar2 = (uint)this->m_coefficient_array[lVar6];
    if (this->m_coefficient_array[lVar6] == 0) {
      iVar5 = iVar5 + 1;
    }
    else {
      iVar4 = iVar5 * 0x10 + 1;
      for (; 0xf < iVar5; iVar5 = iVar5 + -0x10) {
        put_bits(this,this->m_huff_codes[(ulong)bVar7 + 2][0xf0],
                 (uint)this->m_huff_code_sizes[uVar1 + 2][0xf0]);
        iVar4 = iVar4 + -0x100;
      }
      uVar3 = -uVar2;
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
      len = 1;
      for (; 1 < uVar3; uVar3 = uVar3 >> 1) {
        len = len + 1;
        iVar4 = iVar4 + 1;
      }
      put_bits(this,this->m_huff_codes[(ulong)bVar7 + 2][iVar4],
               (uint)this->m_huff_code_sizes[uVar1 + 2][iVar4]);
      put_bits(this,~(-1 << ((byte)len & 0x1f)) & ((int)uVar2 >> 0xf) + uVar2,len);
      iVar5 = 0;
    }
  }
  if (iVar5 != 0) {
    put_bits(this,this->m_huff_codes[(ulong)bVar7 + 2][0],
             (uint)this->m_huff_code_sizes[uVar1 + 2][0]);
    return;
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_two(int component_num)
{
  int i, j, run_len, nbits, temp1, temp2;
  int16 *pSrc = m_coefficient_array;
  uint *codes[2];
  uint8 *code_sizes[2];

  if (component_num == 0)
  {
    codes[0] = m_huff_codes[0 + 0]; codes[1] = m_huff_codes[2 + 0];
    code_sizes[0] = m_huff_code_sizes[0 + 0]; code_sizes[1] = m_huff_code_sizes[2 + 0];
  }
  else
  {
    codes[0] = m_huff_codes[0 + 1]; codes[1] = m_huff_codes[2 + 1];
    code_sizes[0] = m_huff_code_sizes[0 + 1]; code_sizes[1] = m_huff_code_sizes[2 + 1];
  }

  temp1 = temp2 = pSrc[0] - m_last_dc_val[component_num];
  m_last_dc_val[component_num] = pSrc[0];

  if (temp1 < 0)
  {
    temp1 = -temp1; temp2--;
  }

  nbits = 0;
  while (temp1)
  {
    nbits++; temp1 >>= 1;
  }

  put_bits(codes[0][nbits], code_sizes[0][nbits]);
  if (nbits) put_bits(temp2 & ((1 << nbits) - 1), nbits);

  for (run_len = 0, i = 1; i < 64; i++)
  {
    if ((temp1 = m_coefficient_array[i]) == 0)
      run_len++;
    else
    {
      while (run_len >= 16)
      {
        put_bits(codes[1][0xF0], code_sizes[1][0xF0]);
        run_len -= 16;
      }
      if ((temp2 = temp1) < 0)
      {
        temp1 = -temp1;
        temp2--;
      }
      nbits = 1;
      while (temp1 >>= 1)
        nbits++;
      j = (run_len << 4) + nbits;
      put_bits(codes[1][j], code_sizes[1][j]);
      put_bits(temp2 & ((1 << nbits) - 1), nbits);
      run_len = 0;
    }
  }
  if (run_len)
    put_bits(codes[1][0], code_sizes[1][0]);
}